

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O3

void ScaleRowDown4Box_C(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst,int dst_width)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  int iVar6;
  short sVar7;
  short sVar8;
  
  lVar5 = src_stride * 3;
  if (1 < dst_width) {
    iVar6 = 0;
    do {
      *dst = (uint8_t)((uint)src_ptr[lVar5 + 3] +
                       (uint)src_ptr[lVar5 + 2] +
                       (uint)src_ptr[lVar5 + 1] +
                       (uint)src_ptr[lVar5] + (uint)src_ptr[src_stride * 2 + 3] +
                       (uint)src_ptr[src_stride * 2 + 2] +
                       (uint)src_ptr[src_stride * 2 + 1] +
                       (uint)src_ptr[src_stride * 2] + (uint)src_ptr[src_stride + 3] +
                       (uint)src_ptr[src_stride + 2] +
                       (uint)src_ptr[src_stride + 1] + (uint)src_ptr[src_stride] +
                       (uint)src_ptr[3] + (uint)src_ptr[2] + (uint)src_ptr[1] + (uint)*src_ptr + 8
                      >> 4);
      dst[1] = (uint8_t)((uint)src_ptr[lVar5 + 7] +
                         (uint)src_ptr[lVar5 + 6] +
                         (uint)src_ptr[lVar5 + 5] +
                         (uint)src_ptr[lVar5 + 4] + (uint)src_ptr[src_stride * 2 + 7] +
                         (uint)src_ptr[src_stride * 2 + 6] +
                         (uint)src_ptr[src_stride * 2 + 5] +
                         (uint)src_ptr[src_stride * 2 + 4] + (uint)src_ptr[src_stride + 7] +
                         (uint)src_ptr[src_stride + 6] +
                         (uint)src_ptr[src_stride + 5] + (uint)src_ptr[src_stride + 4] +
                         (uint)src_ptr[7] + (uint)src_ptr[6] + (uint)src_ptr[5] + (uint)src_ptr[4] +
                         8 >> 4);
      dst = dst + 2;
      src_ptr = src_ptr + 8;
      iVar6 = iVar6 + 2;
    } while (iVar6 < dst_width + -1);
  }
  if ((dst_width & 1U) != 0) {
    uVar1 = *(undefined4 *)src_ptr;
    uVar2 = *(undefined4 *)(src_ptr + src_stride);
    uVar3 = *(undefined4 *)(src_ptr + src_stride * 2);
    uVar4 = *(undefined4 *)(src_ptr + lVar5);
    sVar8 = (ushort)(byte)((uint)uVar3 >> 0x18) + (ushort)(byte)((uint)uVar3 >> 8);
    sVar7 = (ushort)(byte)((uint)uVar4 >> 0x18) + (ushort)(byte)((uint)uVar4 >> 8);
    *dst = (uint8_t)(CONCAT22(sVar8,sVar8 + (ushort)(byte)((uint)uVar3 >> 0x10) +
                                            ((ushort)uVar3 & 0xff)) +
                     (uint)(ushort)((ushort)(byte)((uint)uVar2 >> 0x18) +
                                    (ushort)(byte)((uint)uVar2 >> 8) +
                                   (ushort)(byte)((uint)uVar2 >> 0x10) + ((ushort)uVar2 & 0xff)) +
                     (uint)(ushort)((ushort)(byte)((uint)uVar1 >> 0x18) +
                                    (ushort)(byte)((uint)uVar1 >> 8) +
                                   (ushort)(byte)((uint)uVar1 >> 0x10) + ((ushort)uVar1 & 0xff)) +
                     CONCAT22(sVar7,sVar7 + (ushort)(byte)((uint)uVar4 >> 0x10) +
                                            ((ushort)uVar4 & 0xff)) + 8 >> 4);
  }
  return;
}

Assistant:

void ScaleRowDown4Box_C(const uint8_t* src_ptr,
                        ptrdiff_t src_stride,
                        uint8_t* dst,
                        int dst_width) {
  intptr_t stride = src_stride;
  int x;
  for (x = 0; x < dst_width - 1; x += 2) {
    dst[0] = (src_ptr[0] + src_ptr[1] + src_ptr[2] + src_ptr[3] +
              src_ptr[stride + 0] + src_ptr[stride + 1] + src_ptr[stride + 2] +
              src_ptr[stride + 3] + src_ptr[stride * 2 + 0] +
              src_ptr[stride * 2 + 1] + src_ptr[stride * 2 + 2] +
              src_ptr[stride * 2 + 3] + src_ptr[stride * 3 + 0] +
              src_ptr[stride * 3 + 1] + src_ptr[stride * 3 + 2] +
              src_ptr[stride * 3 + 3] + 8) >>
             4;
    dst[1] = (src_ptr[4] + src_ptr[5] + src_ptr[6] + src_ptr[7] +
              src_ptr[stride + 4] + src_ptr[stride + 5] + src_ptr[stride + 6] +
              src_ptr[stride + 7] + src_ptr[stride * 2 + 4] +
              src_ptr[stride * 2 + 5] + src_ptr[stride * 2 + 6] +
              src_ptr[stride * 2 + 7] + src_ptr[stride * 3 + 4] +
              src_ptr[stride * 3 + 5] + src_ptr[stride * 3 + 6] +
              src_ptr[stride * 3 + 7] + 8) >>
             4;
    dst += 2;
    src_ptr += 8;
  }
  if (dst_width & 1) {
    dst[0] = (src_ptr[0] + src_ptr[1] + src_ptr[2] + src_ptr[3] +
              src_ptr[stride + 0] + src_ptr[stride + 1] + src_ptr[stride + 2] +
              src_ptr[stride + 3] + src_ptr[stride * 2 + 0] +
              src_ptr[stride * 2 + 1] + src_ptr[stride * 2 + 2] +
              src_ptr[stride * 2 + 3] + src_ptr[stride * 3 + 0] +
              src_ptr[stride * 3 + 1] + src_ptr[stride * 3 + 2] +
              src_ptr[stride * 3 + 3] + 8) >>
             4;
  }
}